

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O0

void __thiscall
MethodInfo::MethodInfo
          (MethodInfo *this,string *_name,bool _isPublic,shared_ptr<TypeInfo> *_returnType)

{
  shared_ptr<TypeInfo> *_returnType_local;
  bool _isPublic_local;
  string *_name_local;
  MethodInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->isPublic = _isPublic;
  std::shared_ptr<TypeInfo>::shared_ptr(&this->returnType,_returnType);
  std::shared_ptr<VariablesInfo>::shared_ptr(&this->arguments);
  std::shared_ptr<VariablesInfo>::shared_ptr(&this->fields);
  return;
}

Assistant:

MethodInfo::MethodInfo( const std::string & _name, bool _isPublic, std::shared_ptr<TypeInfo> _returnType )
	:name( _name ), isPublic( _isPublic ), returnType( _returnType )
{}